

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,string *message)

{
  size_t *psVar1;
  TestCaseInfo *pTVar2;
  IStreamingReporter *pIVar3;
  IRunContext *_runContext;
  allocator local_5ea;
  allocator local_5e9;
  string local_5e8;
  string local_5c8;
  Totals deltaTotals;
  Counts assertions;
  SectionInfo testCaseSection;
  TestCaseStats local_4f0;
  SectionStats testCaseSectionStats;
  ResultBuilder resultBuilder;
  
  makeUnexpectedResultBuilder(&resultBuilder,this);
  resultBuilder.m_data.resultType = FatalErrorCondition;
  std::operator<<((ostream *)&resultBuilder.m_stream,(string *)message);
  ResultBuilder::captureExpression(&resultBuilder);
  handleUnfinishedSections(this);
  _runContext = getGlobalRunContext();
  pTVar2 = this->m_activeTestCaseInfo;
  SectionInfo::SectionInfo
            (&testCaseSection,_runContext,&pTVar2->lineInfo,&pTVar2->name,&pTVar2->description);
  assertions.passed = 0;
  assertions.failedButOk = 0;
  assertions.failed = 1;
  SectionStats::SectionStats(&testCaseSectionStats,&testCaseSection,&assertions,0.0,false);
  pIVar3 = (this->m_reporter).m_p;
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,&testCaseSectionStats);
  deltaTotals.testCases.failedButOk = 0;
  deltaTotals.assertions.failedButOk = 0;
  deltaTotals.testCases.passed = 0;
  deltaTotals.assertions.passed = 0;
  deltaTotals.assertions.failed = 0;
  deltaTotals.testCases.failed = 1;
  pIVar3 = (this->m_reporter).m_p;
  pTVar2 = this->m_activeTestCaseInfo;
  std::__cxx11::string::string((string *)&local_5e8,"",&local_5e9);
  std::__cxx11::string::string((string *)&local_5c8,"",&local_5ea);
  TestCaseStats::TestCaseStats(&local_4f0,pTVar2,&deltaTotals,&local_5e8,&local_5c8,false);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,&local_4f0);
  TestCaseStats::~TestCaseStats(&local_4f0);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5e8);
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  std::__cxx11::string::string((string *)&local_4f0,"",(allocator *)&local_5e8);
  testGroupEnded(this,(string *)&local_4f0,&this->m_totals,1,1);
  std::__cxx11::string::~string((string *)&local_4f0);
  pIVar3 = (this->m_reporter).m_p;
  TestRunStats::TestRunStats((TestRunStats *)&local_4f0,&this->m_runInfo,&this->m_totals,false);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar3,&local_4f0);
  TestRunStats::~TestRunStats((TestRunStats *)&local_4f0);
  SectionStats::~SectionStats(&testCaseSectionStats);
  SectionInfo::~SectionInfo(&testCaseSection);
  ResultBuilder::~ResultBuilder(&resultBuilder);
  return;
}

Assistant:

virtual void handleFatalErrorCondition( std::string const& message ) CATCH_OVERRIDE {
            ResultBuilder resultBuilder = makeUnexpectedResultBuilder();
            resultBuilder.setResultType( ResultWas::FatalErrorCondition );
            resultBuilder << message;
            resultBuilder.captureExpression();

            handleUnfinishedSections();

            // Recreate section for test case (as we will lose the one that was in scope)
            SectionInfo testCaseSection
                (   C_A_T_C_H_Context(),
                    m_activeTestCaseInfo->lineInfo,
                    m_activeTestCaseInfo->name,
                    m_activeTestCaseInfo->description );

            Counts assertions;
            assertions.failed = 1;
            SectionStats testCaseSectionStats( testCaseSection, assertions, 0, false );
            m_reporter->sectionEnded( testCaseSectionStats );

            Totals deltaTotals;
            deltaTotals.testCases.failed = 1;
            m_reporter->testCaseEnded( TestCaseStats(   *m_activeTestCaseInfo,
                                                        deltaTotals,
                                                        "",
                                                        "",
                                                        false ) );
            m_totals.testCases.failed++;
            testGroupEnded( "", m_totals, 1, 1 );
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, false ) );
        }